

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O0

vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *
wallet::coinselector_tests::GroupCoins
          (vector<wallet::COutput,_std::allocator<wallet::COutput>_> *available_coins,
          bool subtract_fee_outputs)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  byte in_SIL;
  long in_FS_OFFSET;
  OutputGroup *group;
  COutput *coin;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *__range2;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *in_stack_ffffffffffffff78;
  vector<wallet::COutput,_std::allocator<wallet::COutput>_> *in_stack_ffffffffffffff80;
  vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *in_stack_ffffffffffffff88;
  reference ancestors;
  shared_ptr<wallet::COutput> *output;
  OutputGroup *in_stack_ffffffffffffffa0;
  COutput *in_stack_ffffffffffffffa8;
  shared_ptr<wallet::COutput> local_28;
  COutput *local_18;
  COutput *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)::
      static_groups == '\0') {
    iVar2 = __cxa_guard_acquire(&GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)
                                 ::static_groups);
    if (iVar2 != 0) {
      std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::vector
                (in_stack_ffffffffffffff78);
      __cxa_atexit(std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::~vector,
                   &GroupCoins::static_groups,&__dso_handle);
      __cxa_guard_release(&GroupCoins(std::vector<wallet::COutput,std::allocator<wallet::COutput>>const&,bool)
                           ::static_groups);
    }
  }
  std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::clear
            (in_stack_ffffffffffffff78);
  local_10 = (COutput *)
             std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::begin
                       (in_stack_ffffffffffffff80);
  local_18 = (COutput *)
             std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>::end
                       (in_stack_ffffffffffffff80);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                      ((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                        *)in_stack_ffffffffffffff88,
                       (__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                        *)in_stack_ffffffffffffff80);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
    ::operator*((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                 *)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff88 = &GroupCoins::static_groups;
    std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::emplace_back<>
              (&GroupCoins::static_groups);
    pvVar3 = std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>::back
                       (in_stack_ffffffffffffff78);
    output = &local_28;
    ancestors = pvVar3;
    std::make_shared<wallet::COutput,wallet::COutput_const&>(in_stack_ffffffffffffffa8);
    OutputGroup::Insert(in_stack_ffffffffffffffa0,output,(size_t)ancestors,
                        (size_t)in_stack_ffffffffffffffa8);
    std::shared_ptr<wallet::COutput>::~shared_ptr
              ((shared_ptr<wallet::COutput> *)in_stack_ffffffffffffff78);
    pvVar3->m_subtract_fee_outputs = (bool)(in_SIL & 1);
    __gnu_cxx::
    __normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
    ::operator++((__normal_iterator<const_wallet::COutput_*,_std::vector<wallet::COutput,_std::allocator<wallet::COutput>_>_>
                  *)in_stack_ffffffffffffff78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return &GroupCoins::static_groups;
  }
  __stack_chk_fail();
}

Assistant:

inline std::vector<OutputGroup>& GroupCoins(const std::vector<COutput>& available_coins, bool subtract_fee_outputs = false)
{
    static std::vector<OutputGroup> static_groups;
    static_groups.clear();
    for (auto& coin : available_coins) {
        static_groups.emplace_back();
        OutputGroup& group = static_groups.back();
        group.Insert(std::make_shared<COutput>(coin), /*ancestors=*/ 0, /*descendants=*/ 0);
        group.m_subtract_fee_outputs = subtract_fee_outputs;
    }
    return static_groups;
}